

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O0

void hwnet::http::HttpSession::onData(Ptr *ss,Ptr *buff,size_t n)

{
  element_type *this;
  any *operand;
  HttpSession *this_00;
  element_type *this_01;
  char *data;
  ostream *this_02;
  size_t sVar1;
  size_t nparsed;
  char *ptr;
  HttpSession *session;
  size_t n_local;
  Ptr *buff_local;
  Ptr *ss_local;
  
  this = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)ss);
  operand = TCPSocket::GetUserData(this);
  this_00 = any_cast<hwnet::http::HttpSession*>(operand);
  this_01 = std::__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)buff);
  data = Buffer::BuffPtr(this_01);
  this_02 = std::operator<<((ostream *)&std::cout,data);
  std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
  sVar1 = http_parser_execute(&this_00->parser,&this_00->settings,data,n);
  if (sVar1 != n) {
    onError(ss,0);
  }
  Recv(this_00);
  return;
}

Assistant:

void HttpSession::onData(const TCPSocket::Ptr &ss,const Buffer::Ptr &buff,size_t n) {
	auto session = any_cast<HttpSession*>(ss->GetUserData());
	auto ptr = buff->BuffPtr();
	std::cout << ptr << std::endl;
	auto nparsed = http_parser_execute(&session->parser,&session->settings,ptr,n);
	if(nparsed != n) {
		onError(ss,0);
	}
	session->Recv();
}